

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  Builder result;
  Reader statements_00;
  Builder result_00;
  bool requiresId;
  ReadableFile *pRVar1;
  ReadableFile *pRVar2;
  BuilderFor<capnp::compiler::ParsedFile> local_2b0;
  Builder local_288;
  Reader local_260;
  undefined1 local_229;
  SegmentBuilder *local_228;
  SegmentBuilder *pSStack_220;
  CapTableBuilder *local_218;
  void *pvStack_210;
  WirePointer *local_208;
  ArrayPtr<const_char> local_1f8;
  undefined1 auStack_1e8 [8];
  Builder statements;
  MallocMessageBuilder lexedBuilder;
  Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_> local_c0;
  Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_> local_a8 [2];
  undefined1 local_88 [8];
  undefined8 local_80;
  Array<const_unsigned_char> local_58;
  undefined1 local_40 [8];
  Array<const_char> content;
  ModuleImpl *this_local;
  Orphanage orphanage_local;
  Orphan<capnp::compiler::ParsedFile> *parsed;
  
  orphanage_local.arena = (BuilderArena *)orphanage.capTable;
  this_local = (ModuleImpl *)orphanage.arena;
  content.disposer = (ArrayDisposer *)this;
  orphanage_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  pRVar1 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator->(&this->file);
  pRVar2 = kj::Own<const_kj::ReadableFile,_std::nullptr_t>::operator->(&this->file);
  (*(pRVar2->super_FsNode)._vptr_FsNode[2])(local_88);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])(&local_58,pRVar1,0,local_80);
  kj::Array<const_unsigned_char>::releaseAsChars((Array<const_char> *)local_40,&local_58);
  kj::Array<const_unsigned_char>::~Array(&local_58);
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::Maybe();
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::operator=
            (&this->lineBreaks,local_a8);
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::~Maybe(local_a8);
  kj::SpaceFor<capnp::compiler::LineBreakTable>::construct<kj::Array<char_const>&>
            ((SpaceFor<capnp::compiler::LineBreakTable> *)
             &lexedBuilder.moreSegments.builder.disposer,(Array<const_char> *)&this->lineBreaksSpace
            );
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::Maybe
            (&local_c0,
             (Own<capnp::compiler::LineBreakTable,_std::nullptr_t> *)
             &lexedBuilder.moreSegments.builder.disposer);
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::operator=
            (&this->lineBreaks,&local_c0);
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>_>::~Maybe(&local_c0);
  kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>::~Own
            ((Own<capnp::compiler::LineBreakTable,_std::nullptr_t> *)
             &lexedBuilder.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&statements._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedStatements>
            ((Builder *)auStack_1e8,(MessageBuilder *)&statements._builder.dataSize);
  local_1f8 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_40);
  local_208 = statements._builder.pointers;
  local_218 = statements._builder.capTable;
  pvStack_210 = statements._builder.data;
  local_228 = (SegmentBuilder *)auStack_1e8;
  pSStack_220 = statements._builder.segment;
  result._builder.capTable = (CapTableBuilder *)statements._builder.segment;
  result._builder.segment = (SegmentBuilder *)auStack_1e8;
  result._builder.data = statements._builder.capTable;
  result._builder.pointers = (WirePointer *)statements._builder.data;
  result._builder._32_8_ = statements._builder.pointers;
  lex(local_1f8,result,(ErrorReporter *)this);
  local_229 = 0;
  Orphanage::newOrphan<capnp::compiler::ParsedFile>(__return_storage_ptr__,(Orphanage *)&this_local)
  ;
  LexedStatements::Builder::getStatements(&local_288,(Builder *)auStack_1e8);
  List::Builder::operator_cast_to_Reader(&local_260,(Builder *)&local_288);
  Orphan<capnp::compiler::ParsedFile>::get(&local_2b0,__return_storage_ptr__);
  requiresId = ModuleLoader::Impl::areFileIdsRequired(this->loader);
  statements_00.reader.capTable = local_260.reader.capTable;
  statements_00.reader.segment = local_260.reader.segment;
  statements_00.reader.ptr = local_260.reader.ptr;
  statements_00.reader.elementCount = local_260.reader.elementCount;
  statements_00.reader.step = local_260.reader.step;
  statements_00.reader.structDataSize = local_260.reader.structDataSize;
  statements_00.reader.structPointerCount = local_260.reader.structPointerCount;
  statements_00.reader.elementSize = local_260.reader.elementSize;
  statements_00.reader._39_1_ = local_260.reader._39_1_;
  statements_00.reader.nestingLimit = local_260.reader.nestingLimit;
  statements_00.reader._44_4_ = local_260.reader._44_4_;
  result_00._builder.capTable = local_2b0._builder.capTable;
  result_00._builder.segment = local_2b0._builder.segment;
  result_00._builder.data = local_2b0._builder.data;
  result_00._builder.pointers = local_2b0._builder.pointers;
  result_00._builder.dataSize = local_2b0._builder.dataSize;
  result_00._builder.pointerCount = local_2b0._builder.pointerCount;
  result_00._builder._38_2_ = local_2b0._builder._38_2_;
  parseFile(statements_00,result_00,(ErrorReporter *)this,requiresId);
  local_229 = 1;
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&statements._builder.dataSize)
  ;
  kj::Array<const_char>::~Array((Array<const_char> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Orphan<ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->mmap(0, file->stat().size).releaseAsChars();

    lineBreaks = kj::none;  // In case loadContent() is called multiple times.
    lineBreaks = lineBreaksSpace.construct(content);

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<LexedStatements>();
    lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<ParsedFile>();
    parseFile(statements.getStatements(), parsed.get(), *this, loader.areFileIdsRequired());
    return parsed;
  }